

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseClassMember(Parser *this)

{
  bool bVar1;
  uint uVar2;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  Parser *in_RDI;
  Parser *in_stack_00000010;
  TokenType in_stack_000000c4;
  Parser *in_stack_000000c8;
  undefined8 local_8;
  
  uVar2 = accept(in_RDI,0x3b,in_RDX,in_RCX);
  if ((uVar2 & 1) == 0) {
    uVar2 = accept(in_RDI,0x56,__addr,in_RCX);
    if ((uVar2 & 1) == 0) {
      bVar1 = expect(in_stack_000000c8,in_stack_000000c4);
      if (bVar1) {
        local_8 = createIdentifierNode(in_stack_00000010,(Token *)this);
      }
      else {
        local_8 = (Node *)0x0;
      }
    }
    else {
      local_8 = createAccessConstructorNode(in_stack_00000010,(Token *)this);
    }
  }
  else {
    local_8 = createBaseNode(in_stack_00000010,(Token *)this);
  }
  return local_8;
}

Assistant:

Node * parseClassMember()
  {
    if (accept(TK_BASE))
      return createBaseNode(*tok);

    if (accept(TK_CONSTRUCTOR))
      return createAccessConstructorNode(*tok);

    if (expect(TK_IDENTIFIER))
      return createIdentifierNode(*tok);

    return nullptr;
  }